

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_init_alloc
              (uint32_t version,size_t inputs_allocation_len,size_t outputs_allocation_len,
              size_t global_unknowns_allocation_len,wally_psbt **output)

{
  wally_psbt *pwVar1;
  wally_psbt_input *pwVar2;
  wally_psbt_output *pwVar3;
  int local_40;
  int ret;
  wally_psbt *result;
  wally_psbt **output_local;
  size_t global_unknowns_allocation_len_local;
  size_t outputs_allocation_len_local;
  size_t inputs_allocation_len_local;
  uint32_t version_local;
  
  if (output == (wally_psbt **)0x0) {
    inputs_allocation_len_local._4_4_ = -2;
  }
  else {
    *output = (wally_psbt *)0x0;
    if (version == 0) {
      pwVar1 = (wally_psbt *)wally_calloc(0x60);
      *output = pwVar1;
      if (*output == (wally_psbt *)0x0) {
        inputs_allocation_len_local._4_4_ = -3;
      }
      else {
        pwVar1 = *output;
        if (inputs_allocation_len != 0) {
          pwVar2 = (wally_psbt_input *)wally_calloc(inputs_allocation_len * 0x110);
          pwVar1->inputs = pwVar2;
        }
        if (outputs_allocation_len != 0) {
          pwVar3 = (wally_psbt_output *)wally_calloc(outputs_allocation_len * 0xd0);
          pwVar1->outputs = pwVar3;
        }
        local_40 = wally_map_init(global_unknowns_allocation_len,&pwVar1->unknowns);
        if (((local_40 == 0) &&
            ((inputs_allocation_len == 0 || (pwVar1->inputs != (wally_psbt_input *)0x0)))) &&
           ((outputs_allocation_len == 0 || (pwVar1->outputs != (wally_psbt_output *)0x0)))) {
          pwVar1->version = 0;
          pwVar1->magic[0] = 'p';
          pwVar1->magic[1] = 's';
          pwVar1->magic[2] = 'b';
          pwVar1->magic[3] = 't';
          pwVar1->magic[4] = 0xff;
          pwVar1->inputs_allocation_len = inputs_allocation_len;
          pwVar1->outputs_allocation_len = outputs_allocation_len;
          pwVar1->tx = (wally_tx *)0x0;
          inputs_allocation_len_local._4_4_ = 0;
        }
        else {
          wally_psbt_free(pwVar1);
          if (local_40 == 0) {
            local_40 = -3;
          }
          inputs_allocation_len_local._4_4_ = local_40;
        }
      }
    }
    else {
      inputs_allocation_len_local._4_4_ = -2;
    }
  }
  return inputs_allocation_len_local._4_4_;
}

Assistant:

int wally_psbt_init_alloc(uint32_t version, size_t inputs_allocation_len,
                          size_t outputs_allocation_len,
                          size_t global_unknowns_allocation_len,
                          struct wally_psbt **output)
{
    struct wally_psbt *result;
    int ret;

    TX_CHECK_OUTPUT;
    if (version)
        return WALLY_EINVAL; /* Only version 0 is specified/supported */
    TX_OUTPUT_ALLOC(struct wally_psbt);

    if (inputs_allocation_len)
        result->inputs = wally_calloc(inputs_allocation_len * sizeof(struct wally_psbt_input));
    if (outputs_allocation_len)
        result->outputs = wally_calloc(outputs_allocation_len * sizeof(struct wally_psbt_output));

    ret = wally_map_init(global_unknowns_allocation_len, &result->unknowns);

    if (ret != WALLY_OK ||
        (inputs_allocation_len && !result->inputs) || (outputs_allocation_len && !result->outputs)) {
        wally_psbt_free(result);
        return ret != WALLY_OK ? ret : WALLY_ENOMEM;
    }

    result->version = version;
    memcpy(result->magic, PSBT_MAGIC, sizeof(PSBT_MAGIC));
    result->inputs_allocation_len = inputs_allocation_len;
    result->outputs_allocation_len = outputs_allocation_len;
    result->tx = NULL;
    return WALLY_OK;
}